

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labelling.cc
# Opt level: O0

bool labelling::operator==(Label *label1,Label *label2)

{
  pointer piVar1;
  double dVar2;
  bool bVar3;
  size_type sVar4;
  const_reference pvVar5;
  vector<int,_std::allocator<int>_> *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  int i;
  int local_1c;
  bool local_1;
  
  if (*(int *)&(in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish ==
      *(int *)&(in_RSI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish) {
    piVar1 = (in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    if (((double)piVar1 !=
         (double)(in_RSI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start) ||
       (NAN((double)piVar1) ||
        NAN((double)(in_RSI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start))) {
      local_1 = false;
    }
    else {
      bVar3 = std::operator==(in_RDI,in_RSI);
      if (((bVar3 ^ 0xffU) & 1) == 0) {
        for (local_1c = 0;
            sVar4 = std::vector<double,_std::allocator<double>_>::size
                              ((vector<double,_std::allocator<double>_> *)
                               &(in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_end_of_storage),
            (ulong)(long)local_1c < sVar4; local_1c = local_1c + 1) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)
                              &(in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_end_of_storage,(long)local_1c);
          dVar2 = *pvVar5;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)
                              &(in_RSI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_end_of_storage,(long)local_1c);
          if ((dVar2 != *pvVar5) || (NAN(dVar2) || NAN(*pvVar5))) {
            return false;
          }
        }
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool operator==(const Label& label1, const Label& label2) {
  if (label1.vertex.lemon_id != label2.vertex.lemon_id)
    return false;
  if (label1.weight != label2.weight)
    return false;
  if (label1.partial_path != label2.partial_path)
    return false;
  /// Check every resource for inequality
  for (int i = 0; i < label1.resource_consumption.size(); i++) {
    if (label1.resource_consumption[i] != label2.resource_consumption[i]) {
      return false;
    }
  }
  return true;
}